

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disco_test.cpp
# Opt level: O2

void __thiscall async_unit_test::single(async_unit_test *this)

{
  ostream *poVar1;
  ulong uVar2;
  uint i;
  long lVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Running async test without error reporting\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  calls = calls + 1;
  cppcms::application::response();
  uVar2 = cppcms::http::response::out();
  for (lVar3 = 0; lVar3 != 100000; lVar3 = lVar3 + 1) {
    poVar1 = std::ostream::_M_insert<unsigned_long>(uVar2);
    std::operator<<(poVar1,'\n');
  }
  cppcms::application::release_context();
  cppcms::http::context::async_complete_response();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return;
}

Assistant:

void single()
	{
		std::cout << "Running async test without error reporting\n" << std::endl;
		calls ++;
		std::ostream &out = response().out();
		for(unsigned i=0;i<100000;i++) {
			out << i << '\n';
		}
		release_context()->async_complete_response();
	}